

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O3

void __thiscall deqp::egl::GLES2ThreadTest::GLES2Context::~GLES2Context(GLES2Context *this)

{
  deInt32 *pdVar1;
  SharedPtrStateBase *pSVar2;
  
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__GLES2Context_003e6a30;
  pSVar2 = (this->resourceManager).m_state;
  if (pSVar2 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &pSVar2->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      (this->resourceManager).m_ptr = (GLES2ResourceManager *)0x0;
      (*((this->resourceManager).m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &((this->resourceManager).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      pSVar2 = (this->resourceManager).m_state;
      if (pSVar2 != (SharedPtrStateBase *)0x0) {
        (*pSVar2->_vptr_SharedPtrStateBase[1])();
      }
      (this->resourceManager).m_state = (SharedPtrStateBase *)0x0;
    }
  }
  tcu::ThreadUtil::Object::~Object(&this->super_Object);
  return;
}

Assistant:

GLES2Context::~GLES2Context (void)
{
}